

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder-test.cc
# Opt level: O1

void __thiscall
ProblemBuilderTest_UseWithNLProblemBuilder_Test::~ProblemBuilderTest_UseWithNLProblemBuilder_Test
          (ProblemBuilderTest_UseWithNLProblemBuilder_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ProblemBuilderTest, UseWithNLProblemBuilder) {
  TestProblemBuilder builder;
  mp::internal::NLProblemBuilder<TestProblemBuilder> handler(builder);
  EXPECT_CALL(builder, ReportUnhandledConstruct(::testing::_)).Times(3);
  handler.OnNumber(0);
  handler.BeginCommonExpr(0, 0);
  handler.EndCommonExpr(0, TestExpr(), 0);
}